

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O1

int compare_func_names(void *a,void *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = *a;
  iVar1 = *b;
  iVar2 = xc_family_from_id(xc_functional_keys[iVar4].number,(int *)0x0,(int *)0x0);
  iVar3 = xc_family_from_id(xc_functional_keys[iVar1].number,(int *)0x0,(int *)0x0);
  iVar5 = -1;
  if (iVar3 <= iVar2) {
    if (iVar3 < iVar2) {
      iVar5 = 1;
    }
    else {
      iVar2 = strncmp(xc_functional_keys[iVar4].name,"hyb_",4);
      iVar3 = strncmp(xc_functional_keys[iVar1].name,"hyb_",4);
      if ((iVar2 == 0 || iVar3 != 0) && (iVar5 = 1, iVar2 != 0 || iVar3 == 0)) {
        iVar4 = strcmp(xc_functional_keys[iVar4].name,xc_functional_keys[iVar1].name);
        return iVar4;
      }
    }
  }
  return iVar5;
}

Assistant:

static int compare_func_names(const void *a, const void *b) {
  int ia, ib;
  int fama, famb;
  int hyba, hybb;

  ia = *(int *)a;
  ib = *(int *)b;

  /* First we sort by the family: LDAs, GGAs, meta-GGAs */
  fama = xc_family_from_id(xc_functional_keys[ia].number, NULL, NULL);
  famb = xc_family_from_id(xc_functional_keys[ib].number, NULL, NULL);
  if(fama < famb)
    return -1;
  else if(fama > famb)
    return 1;

  /* Then we sort by hybrid type: non-hybrids go first */
  hyba = (strncmp(xc_functional_keys[ia].name, "hyb_", 4) == 0);
  hybb = (strncmp(xc_functional_keys[ib].name, "hyb_", 4) == 0);
  if(!hyba && hybb)
    return -1;
  else if(hyba && !hybb)
    return 1;

  /* Last we sort by name */
  return strcmp(xc_functional_keys[ia].name, xc_functional_keys[ib].name);
}